

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

EncodingResult<kj::Array<wchar_t>_> *
kj::encodeWideString
          (EncodingResult<kj::Array<wchar_t>_> *__return_storage_ptr__,ArrayPtr<const_char> text,
          bool nulTerminate)

{
  char32_t *pcVar1;
  size_t sVar2;
  undefined7 in_register_00000009;
  bool in_R8B;
  ArrayPtr<const_char> text_00;
  Array<wchar_t> result;
  Array<char32_t> local_78;
  Array<wchar_t> local_58;
  EncodingResult<kj::Array<char32_t>_> local_38;
  
  text_00.size_._1_7_ = in_register_00000009;
  text_00.size_._0_1_ = nulTerminate;
  text_00.ptr = (char *)text.size_;
  encodeUtf32(&local_38,(kj *)text.ptr,text_00,in_R8B);
  sVar2 = local_38.super_Array<char32_t>.size_;
  pcVar1 = local_38.super_Array<char32_t>.ptr;
  local_38.super_Array<char32_t>.ptr = (char32_t *)0x0;
  local_38.super_Array<char32_t>.size_ = 0;
  local_58.disposer = local_38.super_Array<char32_t>.disposer;
  local_78.ptr = (char32_t *)0x0;
  local_78.size_ = 0;
  local_78.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->super_Array<wchar_t>).ptr = pcVar1;
  (__return_storage_ptr__->super_Array<wchar_t>).size_ = sVar2;
  (__return_storage_ptr__->super_Array<wchar_t>).disposer = local_38.super_Array<char32_t>.disposer;
  local_58.ptr = (wchar_t *)0x0;
  local_58.size_ = 0;
  __return_storage_ptr__->hadErrors = local_38.hadErrors;
  Array<wchar_t>::~Array(&local_58);
  Array<char32_t>::~Array(&local_78);
  Array<char32_t>::~Array(&local_38.super_Array<char32_t>);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<wchar_t>> encodeWideString(ArrayPtr<const char> text, bool nulTerminate) {
  return coerceTo<wchar_t>(WideConverter<sizeof(wchar_t)>::encode(text, nulTerminate));
}